

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  uint new_size;
  int iVar1;
  ImDrawCmd *pIVar2;
  ImDrawChannel *pIVar3;
  ImDrawCmd *pIVar4;
  ImDrawList *this_00;
  ImVector<ImDrawCmd> *in_RSI;
  ImDrawCmd *in_RDI;
  ImDrawCmd *curr_cmd;
  int sz_1;
  int sz;
  ImDrawChannel *ch_1;
  int i_1;
  ImDrawIdx *idx_write;
  ImDrawCmd *cmd_write;
  int cmd_n;
  ImDrawCmd *next_cmd;
  ImDrawChannel *ch;
  int i;
  int idx_offset;
  ImDrawCmd *last_cmd;
  int new_idx_buffer_count;
  int new_cmd_buffer_count;
  ImDrawList *in_stack_ffffffffffffff80;
  ImVector<ImDrawCmd> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ImDrawListSplitter *in_stack_ffffffffffffffa0;
  int local_54;
  ImDrawCmd *local_48;
  int local_3c;
  int local_28;
  uint local_24;
  ImDrawCmd *local_20;
  int local_18;
  int local_14;
  
  if (1 < (int)(in_RDI->ClipRect).y) {
    SetCurrentChannel(in_stack_ffffffffffffffa0,
                      (ImDrawList *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    ImDrawList::_PopUnusedDrawCmd(in_stack_ffffffffffffff80);
    local_14 = 0;
    local_18 = 0;
    if (((int)(in_RDI->ClipRect).y < 1) || (in_RSI->Size < 1)) {
      pIVar2 = (ImDrawCmd *)0x0;
    }
    else {
      pIVar2 = ImVector<ImDrawCmd>::back(in_RSI);
    }
    if (pIVar2 == (ImDrawCmd *)0x0) {
      new_size = 0;
    }
    else {
      new_size = pIVar2->IdxOffset + pIVar2->ElemCount;
    }
    local_24 = new_size;
    local_20 = pIVar2;
    for (local_28 = 1; local_28 < (int)(in_RDI->ClipRect).y; local_28 = local_28 + 1) {
      pIVar3 = ImVector<ImDrawChannel>::operator[]
                         ((ImVector<ImDrawChannel> *)&(in_RDI->ClipRect).z,local_28);
      if ((0 < (pIVar3->_CmdBuffer).Size) &&
         (pIVar4 = ImVector<ImDrawCmd>::back(&pIVar3->_CmdBuffer), pIVar4->ElemCount == 0)) {
        ImVector<ImDrawCmd>::pop_back(&pIVar3->_CmdBuffer);
      }
      if ((0 < (pIVar3->_CmdBuffer).Size) && (local_20 != (ImDrawCmd *)0x0)) {
        pIVar4 = ImVector<ImDrawCmd>::operator[](&pIVar3->_CmdBuffer,0);
        iVar1 = memcmp(local_20,pIVar4,0x1c);
        if ((iVar1 == 0) &&
           ((local_20->UserCallback == (ImDrawCallback)0x0 &&
            (pIVar4->UserCallback == (ImDrawCallback)0x0)))) {
          local_20->ElemCount = pIVar4->ElemCount + local_20->ElemCount;
          local_24 = pIVar4->ElemCount + local_24;
          ImVector<ImDrawCmd>::erase(in_stack_ffffffffffffff90,in_RDI);
        }
      }
      if (0 < (pIVar3->_CmdBuffer).Size) {
        local_20 = ImVector<ImDrawCmd>::back(&pIVar3->_CmdBuffer);
      }
      local_14 = (pIVar3->_CmdBuffer).Size + local_14;
      local_18 = (pIVar3->_IdxBuffer).Size + local_18;
      for (local_3c = 0; local_3c < (pIVar3->_CmdBuffer).Size; local_3c = local_3c + 1) {
        (pIVar3->_CmdBuffer).Data[local_3c].IdxOffset = local_24;
        local_24 = (pIVar3->_CmdBuffer).Data[local_3c].ElemCount + local_24;
      }
    }
    ImVector<ImDrawCmd>::resize((ImVector<ImDrawCmd> *)pIVar2,new_size);
    ImVector<unsigned_short>::resize((ImVector<unsigned_short> *)pIVar2,new_size);
    local_48 = in_RSI->Data + ((long)in_RSI->Size - (long)local_14);
    this_00 = (ImDrawList *)((long)in_RSI[1].Data + (long)local_18 * -2 + (long)in_RSI[1].Size * 2);
    for (local_54 = 1; local_54 < (int)(in_RDI->ClipRect).y; local_54 = local_54 + 1) {
      pIVar3 = ImVector<ImDrawChannel>::operator[]
                         ((ImVector<ImDrawChannel> *)&(in_RDI->ClipRect).z,local_54);
      iVar1 = (pIVar3->_CmdBuffer).Size;
      if (iVar1 != 0) {
        memcpy(local_48,(pIVar3->_CmdBuffer).Data,(long)iVar1 * 0x38);
        local_48 = local_48 + iVar1;
      }
      iVar1 = (pIVar3->_IdxBuffer).Size;
      if (iVar1 != 0) {
        memcpy(this_00,(pIVar3->_IdxBuffer).Data,(long)iVar1 << 1);
        this_00 = (ImDrawList *)((long)&(this_00->CmdBuffer).Size + (long)iVar1 * 2);
      }
    }
    *(ImDrawList **)(in_RSI + 5) = this_00;
    if ((in_RSI->Size == 0) ||
       (pIVar2 = ImVector<ImDrawCmd>::back(in_RSI), pIVar2->UserCallback != (ImDrawCallback)0x0)) {
      ImDrawList::AddDrawCmd(this_00);
    }
    pIVar2 = in_RSI->Data + (in_RSI->Size + -1);
    if (pIVar2->ElemCount == 0) {
      *(ImDrawCmd **)&pIVar2->ClipRect = in_RSI[8].Data;
      iVar1 = in_RSI[9].Capacity;
      (pIVar2->ClipRect).z = (float)in_RSI[9].Size;
      (pIVar2->ClipRect).w = (float)iVar1;
      pIVar2->TextureId = in_RSI[9].Data;
      pIVar2->VtxOffset = in_RSI[10].Size;
    }
    else {
      iVar1 = memcmp(pIVar2,&in_RSI[8].Data,0x1c);
      if (iVar1 != 0) {
        ImDrawList::AddDrawCmd(this_00);
      }
    }
    (in_RDI->ClipRect).y = 1.4013e-45;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}